

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O1

libcaption_stauts_t cea708_to_caption_frame(caption_frame_t *frame,cea708_t *cea708)

{
  cc_data_t cVar1;
  ushort uVar2;
  libcaption_stauts_t lVar3;
  libcaption_stauts_t lVar4;
  libcaption_stauts_t lVar5;
  ulong uVar6;
  
  lVar5 = LIBCAPTION_OK;
  if ((cea708->user_identifier == 0x47413934) &&
     (uVar2 = *(ushort *)&cea708->user_data >> 3, (uVar2 & 0x1f) != 0)) {
    uVar6 = 0;
    do {
      cVar1 = (cea708->user_data).cc_data[uVar6];
      if (((uint)cVar1 & 0xe0) == 0x20) {
        lVar3 = caption_frame_decode(frame,cVar1._1_2_,cea708->timestamp);
        lVar4 = lVar3;
        if (lVar5 == LIBCAPTION_READY) {
          lVar4 = lVar5;
        }
        if (lVar3 == LIBCAPTION_ERROR) {
          lVar4 = lVar3;
        }
        if (lVar5 != LIBCAPTION_ERROR) {
          lVar5 = lVar4;
        }
      }
      uVar6 = uVar6 + 1;
    } while ((uVar2 & 0x1f) != uVar6);
  }
  return lVar5;
}

Assistant:

libcaption_stauts_t cea708_to_caption_frame(caption_frame_t* frame, cea708_t* cea708)
{
    int i, count = cea708_cc_count(&cea708->user_data);
    libcaption_stauts_t status = LIBCAPTION_OK;

    if (GA94 == cea708->user_identifier) {
        for (i = 0; i < count; ++i) {
            int valid;
            cea708_cc_type_t type;
            uint16_t cc_data = cea708_cc_data(&cea708->user_data, i, &valid, &type);

            if (valid && cc_type_ntsc_cc_field_1 == type) {
                status = libcaption_status_update(status, caption_frame_decode(frame, cc_data, cea708->timestamp));
            }
        }
    }

    return status;
}